

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnAtomicWaitExpr
          (BinaryReaderInterp *this,Opcode opcode,Index memidx,Address align_log2,Address offset)

{
  State *pSVar1;
  Result RVar2;
  Address alignment;
  Location loc_1;
  Location loc;
  Location local_b8;
  Location local_98;
  Var local_78;
  
  local_98.field_1.field_0.last_column = 0;
  local_98.filename._M_len = (this->filename_)._M_len;
  local_98.filename._M_str = (this->filename_)._M_str;
  pSVar1 = (this->super_BinaryReaderNop).super_BinaryReaderDelegate.state;
  local_98.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)pSVar1->offset;
  local_b8.field_1.field_0.last_column = 0;
  local_b8.filename._M_len = (this->filename_)._M_len;
  local_b8.filename._M_str = (this->filename_)._M_str;
  local_b8.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)pSVar1->offset;
  Var::Var(&local_78,memidx,&local_b8);
  alignment = 0xffffffff;
  if (align_log2 < 0x20) {
    alignment = (ulong)(uint)(1 << ((byte)align_log2 & 0x1f));
  }
  RVar2 = SharedValidator::OnAtomicWait(&this->validator_,&local_98,opcode,&local_78,alignment);
  Var::~Var(&local_78);
  if (RVar2.enum_ != Error) {
    Istream::Emit(this->istream_,opcode.enum_,memidx,(u32)offset);
  }
  return (Result)(uint)(RVar2.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::OnAtomicWaitExpr(Opcode opcode,
                                            Index memidx,
                                            Address align_log2,
                                            Address offset) {
  CHECK_RESULT(validator_.OnAtomicWait(GetLocation(), opcode,
                                       Var(memidx, GetLocation()),
                                       GetAlignment(align_log2)));
  istream_.Emit(opcode, memidx, offset);
  return Result::Ok;
}